

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInterpolationSequenceRecord.hpp
# Opt level: O2

InterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>
* __thiscall
njoy::ENDFtk::
readInterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>
           *__return_storage_ptr__,ENDFtk *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_stack_ffffffffffffff48;
  vector<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  local_a8;
  InterpolationRecord interpolation;
  
  InterpolationRecord::
  InterpolationRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&interpolation,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
  readSequence<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_a8,this,begin,end,(long *)((ulong)lineNumber & 0xffffffff),MAT,MF,
             (int)interpolation.super_InterpolationBase.boundaryIndices.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish[-1],in_stack_ffffffffffffff48);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>
  ::InterpolationSequenceRecord(__return_storage_ptr__,&interpolation,&local_a8);
  std::
  vector<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ::~vector(&local_a8);
  record::InterpolationBase::~InterpolationBase(&interpolation.super_InterpolationBase);
  return __return_storage_ptr__;
}

Assistant:

InterpolationSequenceRecord< Component >
readInterpolationSequenceRecord( Iterator& begin,
                                 const Iterator& end,
                                 long& lineNumber,
                                 int MAT,
                                 int MF,
                                 int MT ) {

  InterpolationRecord interpolation( begin, end, lineNumber, MAT, MF, MT );
  return InterpolationSequenceRecord(
             std::move( interpolation ),
             readSequence< Component >( begin, end, lineNumber, MAT, MF, MT,
                                        interpolation.NZ() ) );
}